

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O1

size_t ht_system_info_push_system_info_to_listener
                 (HT_TimelineListenerCallback callback,void *listener,HT_Boolean serialize)

{
  MKCREFLECT_TypeInfo *pMVar1;
  size_t sVar2;
  HT_Byte buffer [64];
  HT_Event local_88;
  undefined1 local_70;
  undefined2 local_6f;
  HT_Byte local_68 [72];
  
  pMVar1 = ht_HT_SystemInfoEvent_get_event_klass_instance::klass_instance.type_info;
  local_88.klass = &ht_HT_SystemInfoEvent_get_event_klass_instance::klass_instance;
  local_88.timestamp = 0;
  local_88.id = 0;
  local_70 = 0;
  local_6f = 0xb;
  if (serialize == 0) {
    memcpy(local_68,&local_88,
           (ht_HT_SystemInfoEvent_get_event_klass_instance::klass_instance.type_info)->size);
    sVar2 = pMVar1->size;
  }
  else {
    sVar2 = (*ht_HT_SystemInfoEvent_get_event_klass_instance::klass_instance.serialize)
                      (&local_88,local_68);
  }
  (*callback)(local_68,sVar2,serialize,listener);
  return sVar2;
}

Assistant:

size_t
ht_system_info_push_system_info_to_listener(HT_TimelineListenerCallback callback, void* listener, HT_Boolean serialize)
{
    size_t data_size;
    HT_DECL_EVENT(HT_SystemInfoEvent, event);
    event.base.id = event.base.timestamp = 0;
    event.version_major = HT_VERSION_MAJOR;
    event.version_minor = HT_VERSION_MINOR;
    event.version_patch = HT_VERSION_PATCH;

    HT_Byte buffer[64];

    data_size = ht_event_utils_serialize_event_to_buffer(HT_EVENT(&event), buffer, serialize);

    callback(buffer, data_size, serialize, listener);

    return data_size;
}